

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNode<QString,_RCCFileInfo_*>::MultiNode
          (MultiNode<QString,_RCCFileInfo_*> *this,MultiNode<QString,_RCCFileInfo_*> *other)

{
  Chain *pCVar1;
  Chain *pCVar2;
  Chain **ppCVar3;
  MultiNodeChain<RCCFileInfo_*> **ppMVar4;
  
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this,(QArrayDataPointer<char16_t> *)other);
  ppMVar4 = &this->value;
  ppCVar3 = &other->value;
  while (pCVar1 = *ppCVar3, pCVar1 != (Chain *)0x0) {
    pCVar2 = (Chain *)operator_new(0x10);
    pCVar2->value = pCVar1->value;
    pCVar2->next = (MultiNodeChain<RCCFileInfo_*> *)0x0;
    *ppMVar4 = pCVar2;
    ppMVar4 = &pCVar2->next;
    ppCVar3 = &pCVar1->next;
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }